

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.cpp
# Opt level: O1

void __thiscall
OpenMD::TimeCorrFunc<double>::TimeCorrFunc
          (TimeCorrFunc<double> *this,SimInfo *info,string *filename,string *sele1,string *sele2)

{
  pointer pcVar1;
  Globals *pGVar2;
  ProgressBar *pPVar3;
  int iVar4;
  uint uVar5;
  DumpReader *this_00;
  ProgressBar *this_01;
  double zeroType;
  value_type_conflict2 local_3c;
  value_type_conflict local_38;
  
  (this->super_DynamicProperty).outputFilename_._M_dataplus._M_p =
       (pointer)&(this->super_DynamicProperty).outputFilename_.field_2;
  (this->super_DynamicProperty).outputFilename_._M_string_length = 0;
  (this->super_DynamicProperty).outputFilename_.field_2._M_local_buf[0] = '\0';
  (this->super_DynamicProperty).selectionModeRestart_ = false;
  (this->super_DynamicProperty)._vptr_DynamicProperty = (_func_int **)&PTR__TimeCorrFunc_002f3cf8;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  this->dtMean_ = 0.0;
  this->dtSigma_ = 0.0;
  this->info_ = info;
  (this->dumpFilename_)._M_dataplus._M_p = (pointer)&(this->dumpFilename_).field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->dumpFilename_,pcVar1,pcVar1 + filename->_M_string_length);
  SelectionManager::SelectionManager(&this->seleMan1_,this->info_);
  SelectionManager::SelectionManager(&this->seleMan2_,this->info_);
  (this->selectionScript1_)._M_dataplus._M_p = (pointer)&(this->selectionScript1_).field_2;
  pcVar1 = (sele1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript1_,pcVar1,pcVar1 + sele1->_M_string_length);
  (this->selectionScript2_)._M_dataplus._M_p = (pointer)&(this->selectionScript2_).field_2;
  pcVar1 = (sele2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript2_,pcVar1,pcVar1 + sele2->_M_string_length);
  SelectionEvaluator::SelectionEvaluator(&this->evaluator1_,this->info_);
  SelectionEvaluator::SelectionEvaluator(&this->evaluator2_,this->info_);
  this->doBondProperties_ = false;
  this->allowTimeFuzz_ = false;
  this->autoCorrFunc_ = false;
  this->doSystemProperties_ = false;
  this->doMolecularProperties_ = false;
  this->doObjectProperties_ = false;
  (this->corrFuncType_)._M_dataplus._M_p = (pointer)&(this->corrFuncType_).field_2;
  (this->corrFuncType_)._M_string_length = 0;
  (this->corrFuncType_).field_2._M_local_buf[0] = '\0';
  (this->paramString_)._M_dataplus._M_p = (pointer)&(this->paramString_).field_2;
  (this->paramString_)._M_string_length = 0;
  (this->paramString_).field_2._M_local_buf[0] = '\0';
  (this->labelString_)._M_dataplus._M_p = (pointer)&(this->labelString_).field_2;
  (this->labelString_)._M_string_length = 0;
  (this->labelString_).field_2._M_local_buf[0] = '\0';
  memset(&this->sele1ToIndex_,0,0x98);
  this_00 = (DumpReader *)operator_new(0x1258);
  DumpReader::DumpReader(this_00,this->info_,&this->dumpFilename_);
  this->reader_ = this_00;
  iVar4 = std::__cxx11::string::compare((string *)sele1);
  this->uniqueSelections_ = iVar4 != 0;
  pGVar2 = this->info_->simParams_;
  if ((pGVar2->SampleTime).super_ParameterBase.empty_ == false) {
    this->deltaTime_ = (pGVar2->SampleTime).data_;
  }
  else {
    builtin_strncpy(painCave.errMsg,"TimeCorrFunc Error: can not figure out deltaTime\n",0x32);
    painCave.isFatal = 1;
    simError();
  }
  builtin_strncpy(painCave.errMsg,"Scanning for frames.",0x15);
  painCave.isFatal = 0;
  painCave.severity = 3;
  simError();
  uVar5 = DumpReader::getNFrames(this->reader_);
  this->nFrames_ = uVar5;
  this->nTimeBins_ = uVar5;
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::resize(&this->histogram_,(ulong)uVar5,&local_38);
  local_3c = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->count_,(ulong)this->nTimeBins_,&local_3c);
  std::vector<double,_std::allocator<double>_>::resize(&this->times_,(long)this->nFrames_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->sele1ToIndex_,(long)this->nFrames_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->GIDtoSele1_,(long)this->nFrames_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->selection1StartFrame_,(long)this->nFrames_);
  if (this->uniqueSelections_ == true) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::resize(&this->sele2ToIndex_,(long)this->nFrames_);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::resize(&this->GIDtoSele2_,(long)this->nFrames_);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::resize(&this->selection2StartFrame_,(long)this->nFrames_);
  }
  this_01 = (ProgressBar *)operator_new(0x20);
  ProgressBar::ProgressBar(this_01);
  pPVar3 = (this->progressBar_)._M_t.
           super___uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>.
           _M_t.
           super__Tuple_impl<0UL,_OpenMD::ProgressBar_*,_std::default_delete<OpenMD::ProgressBar>_>.
           super__Head_base<0UL,_OpenMD::ProgressBar_*,_false>._M_head_impl;
  (this->progressBar_)._M_t.
  super___uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::ProgressBar_*,_std::default_delete<OpenMD::ProgressBar>_>.
  super__Head_base<0UL,_OpenMD::ProgressBar_*,_false>._M_head_impl = this_01;
  if (pPVar3 != (ProgressBar *)0x0) {
    operator_delete(pPVar3,0x20);
  }
  return;
}

Assistant:

TimeCorrFunc<T>::TimeCorrFunc(SimInfo* info, const string& filename,
                                const string& sele1, const string& sele2) :
      info_(info),
      dumpFilename_(filename), seleMan1_(info_), seleMan2_(info_),
      selectionScript1_(sele1), selectionScript2_(sele2), evaluator1_(info_),
      evaluator2_(info_), autoCorrFunc_(false), doSystemProperties_(false),
      doMolecularProperties_(false), doObjectProperties_(false),
      doBondProperties_(false), allowTimeFuzz_(false) {
    reader_ = new DumpReader(info_, dumpFilename_);

    uniqueSelections_ = (sele1.compare(sele2) != 0) ? true : false;

    Globals* simParams = info_->getSimParams();
    if (simParams->haveSampleTime()) {
      deltaTime_ = simParams->getSampleTime();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "TimeCorrFunc Error: can not figure out deltaTime\n");
      painCave.isFatal = 1;
      simError();
    }

    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "Scanning for frames.");
    painCave.isFatal  = 0;
    painCave.severity = OPENMD_INFO;
    simError();

    nFrames_   = reader_->getNFrames();
    nTimeBins_ = nFrames_;

    T zeroType(0.0);
    histogram_.resize(nTimeBins_, zeroType);
    count_.resize(nTimeBins_, 0);

    times_.resize(nFrames_);
    sele1ToIndex_.resize(nFrames_);
    GIDtoSele1_.resize(nFrames_);
    selection1StartFrame_.resize(nFrames_);

    if (uniqueSelections_) { 
      sele2ToIndex_.resize(nFrames_); 
      GIDtoSele2_.resize(nFrames_);
      selection2StartFrame_.resize(nFrames_);
    }

    progressBar_ = std::make_unique<ProgressBar>();
  }